

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O2

BOOLEAN __thiscall
BVSparse<Memory::JitArenaAllocator>::TestAndSet(BVSparse<Memory::JitArenaAllocator> *this,BVIndex i)

{
  BOOLEAN BVar1;
  SparseBVUnit *this_00;
  
  this_00 = BitsFromIndex(this,i,true);
  BVar1 = BVUnitT<unsigned_long>::Test(this_00,i & 0x3f);
  BVUnitT<unsigned_long>::Set(this_00,i & 0x3f);
  return BVar1;
}

Assistant:

BOOLEAN
BVSparse<TAllocator>::TestAndSet(BVIndex i)
{
    SparseBVUnit * bvUnit = this->BitsFromIndex(i);
    BVIndex bvIndex = SparseBVUnit::Offset(i);
    BOOLEAN bit = bvUnit->Test(bvIndex);
    bvUnit->Set(bvIndex);
    return bit;
}